

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall FastLinearExpert::queryNewPredXVar(FastLinearExpert *this,Z *z,Scal hNorm)

{
  double dVar1;
  ResScalar RVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Z g;
  Z f;
  Z newSz;
  void *local_178;
  undefined8 uStack_170;
  void *local_168;
  undefined8 uStack_160;
  double local_158;
  double local_140;
  void *local_138 [2];
  ResScalar local_128;
  double local_118;
  undefined8 uStack_110;
  void **local_100;
  Index local_f8;
  double local_e8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_e0;
  undefined1 local_d0 [112];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_60 [8];
  Index local_58;
  Scal local_48;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_40;
  
  local_158 = pow((this->super_LinearExpert).H + hNorm,(this->super_LinearExpert).alpha);
  local_158 = local_158 - hNorm;
  dVar1 = pow((this->super_LinearExpert).H,(this->super_LinearExpert).alpha);
  local_158 = local_158 / dVar1;
  local_118 = (this->super_LinearExpert).Sh * local_158;
  uStack_110 = 0;
  local_e0 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->super_LinearExpert).Sz;
  local_f8 = (this->super_LinearExpert).Sz.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_58 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_e8 = local_158;
  local_48 = hNorm;
  local_40 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_d0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_100,local_60);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_138,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_d0);
  local_100 = &local_168;
  local_168 = (void *)0x0;
  uStack_160 = 0;
  local_178 = (void *)0x0;
  uStack_170 = 0;
  local_d0._0_8_ = &this->invSzz;
  local_d0._8_8_ = z;
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d0);
  local_100 = &local_178;
  local_d0._0_8_ = &this->invSzz;
  local_d0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_138;
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d0);
  local_128 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z);
  local_140 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_178,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z);
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_178,
                (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_138);
  dVar9 = local_118 + hNorm;
  dVar5 = local_158 / hNorm + local_128;
  dVar7 = 1.0 - local_128 / dVar5;
  dVar5 = local_140 / dVar5;
  dVar1 = RVar2 - local_140 * dVar5;
  dVar6 = dVar7 * local_140 * dVar9 - dVar1;
  dVar8 = local_158 * dVar9 - dVar1;
  auVar3._8_8_ = local_128 * dVar7 +
                 (local_140 * -2.0 * dVar7 + ((dVar6 * dVar6) / dVar8 + dVar1) / dVar9) / dVar9;
  auVar3._0_8_ = 0x3ff0000000000000;
  auVar4._8_8_ = local_158;
  auVar4._0_8_ = dVar9;
  auVar4 = divpd(auVar3,auVar4);
  (this->super_LinearExpert).newGamma = auVar4._8_8_ + auVar4._0_8_;
  dVar9 = (dVar6 / dVar8 + -1.0) / dVar9;
  dVar1 = (hNorm - dVar5) * dVar9 * dVar9;
  dVar5 = ((hNorm - (dVar5 + dVar5)) * dVar9 + dVar7) * dVar7 - dVar1 * dVar5;
  local_e8 = (dVar5 + dVar5) / local_158;
  local_f8 = uStack_160;
  dVar1 = dVar9 * dVar7 + dVar1;
  local_48 = (dVar1 + dVar1) / local_158;
  local_58 = uStack_170;
  local_e0 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168;
  local_40 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_178;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_d0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_100,local_60);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&(this->super_LinearExpert).dNewGamma,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_d0);
  free(local_178);
  free(local_168);
  free(local_138[0]);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::queryNewPredXVar(Z const &z, Scal hNorm)
{
    Scal decay = (pow(H+hNorm,alpha) - hNorm) / pow(H,alpha);

    Scal newSh = decay * Sh + hNorm;
    Z newSz = decay * Sz + hNorm * z;

    Z f,g;
    f.noalias() = invSzz * z;
    g.noalias() = invSzz * newSz;

    Scal a = f.dot( z );
    Scal b = g.dot( z );
    Scal c = g.dot( newSz );

    Scal dd = decay / hNorm + a;
    Scal e = 1.0 - a / dd;
    Scal i = b / dd;
    Scal k = c - b*i;
    Scal m = b*e*newSh - k;
    Scal n = decay * newSh - k;

    newGamma = 1.0 / newSh + (a*e + ((k+m*m/n)/newSh-2*b*e)/newSh)/decay;

    Scal o = (m/n - 1.0)/newSh;
    Scal p = (hNorm-i)*o*o;

    dNewGamma = (2.0*(e*(e+(hNorm-2*i)*o)-i*p)/decay) * f + (2.0*(e*o+p)/decay)*g;
}